

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IteratorSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,Type *args_2,Type *args_3)

{
  string_view name;
  IteratorSymbol *pIVar1;
  Type *in_RCX;
  IteratorSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  Type *in_R8;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pIVar1 = (IteratorSymbol *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  ast::IteratorSymbol::IteratorSymbol(in_RDX,name,in_RSI,in_RCX,in_R8);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }